

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

void Abs_ManSupport2_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vSupp_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    if ((((*(ulong *)pObj >> 0x3e & 1) == 0) && (iVar1 = Gia_ObjIsRo(p,pObj), iVar1 == 0)) &&
       (iVar1 = Gia_ObjRefNum(p,pObj), iVar1 < 1)) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                      ,0x1f6,"void Abs_ManSupport2_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      pGVar2 = Gia_ObjFanin0(pObj);
      Abs_ManSupport2_rec(p,pGVar2,vSupp);
      pGVar2 = Gia_ObjFanin1(pObj);
      Abs_ManSupport2_rec(p,pGVar2,vSupp);
    }
    else {
      iVar1 = Gia_ObjId(p,pObj);
      Vec_IntPush(vSupp,iVar1);
    }
  }
  return;
}

Assistant:

void Abs_ManSupport2_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( pObj->fMark1 || Gia_ObjIsRo(p, pObj) || Gia_ObjRefNum(p, pObj) > 0 )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Abs_ManSupport2_rec( p, Gia_ObjFanin0(pObj), vSupp );
    Abs_ManSupport2_rec( p, Gia_ObjFanin1(pObj), vSupp );
}